

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.cpp
# Opt level: O2

dtime_t __thiscall duckdb::Interval::Add(Interval *this,dtime_t left,interval_t right,date_t *date)

{
  dtime_t dVar1;
  int iVar2;
  long lVar3;
  
  dVar1.micros = right._0_8_ % 86400000000 + (long)this;
  if (dVar1.micros < 86400000000) {
    if (-1 < dVar1.micros) {
      return (dtime_t)dVar1.micros;
    }
    lVar3 = 86400000000;
    iVar2 = -1;
  }
  else {
    iVar2 = 1;
    lVar3 = -86400000000;
  }
  *(int *)right.micros = *(int *)right.micros + iVar2;
  return (dtime_t)(dVar1.micros + lVar3);
}

Assistant:

dtime_t Interval::Add(dtime_t left, interval_t right, date_t &date) {
	int64_t diff = right.micros - ((right.micros / Interval::MICROS_PER_DAY) * Interval::MICROS_PER_DAY);
	left += diff;
	if (left.micros >= Interval::MICROS_PER_DAY) {
		left.micros -= Interval::MICROS_PER_DAY;
		date.days++;
	} else if (left.micros < 0) {
		left.micros += Interval::MICROS_PER_DAY;
		date.days--;
	}
	return left;
}